

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piecewise_linear.cpp
# Opt level: O2

bool __thiscall
mp::
BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::SinhId>_>
::InitPeriodic(BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::SinhId>_>
               *this)

{
  PLApproxParams *pPVar1;
  int iVar2;
  double extraout_XMM0_Qa;
  double dVar3;
  double dVar4;
  double in_XMM1_Qa;
  _Vector_base<double,_std::allocator<double>_> local_30;
  
  iVar2 = (*this->_vptr_BasicPLApproximator[6])();
  if (SUB41(iVar2,0) != false) {
    (*this->_vptr_BasicPLApproximator[8])(&local_30,this);
    std::vector<double,_std::allocator<double>_>::_M_move_assign(&this->breakpoints_,&local_30);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_30);
    (*this->_vptr_BasicPLApproximator[7])(this);
    pPVar1 = this->laPrm_;
    pPVar1->fUsePeriod = true;
    in_XMM1_Qa = in_XMM1_Qa - extraout_XMM0_Qa;
    pPVar1->periodLength = in_XMM1_Qa;
    dVar4 = (this->breakpoints_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish[-1];
    (pPVar1->periodRemainderRange).lb =
         *(this->breakpoints_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start;
    (pPVar1->periodRemainderRange).ub = dVar4;
    dVar4 = this->ubx_;
    dVar3 = floor((this->lbx_ - extraout_XMM0_Qa) / in_XMM1_Qa);
    dVar4 = ceil((dVar4 - extraout_XMM0_Qa) / in_XMM1_Qa);
    (pPVar1->periodicFactorRange).lb = dVar3;
    (pPVar1->periodicFactorRange).ub = dVar4;
  }
  return SUB41(iVar2,0);
}

Assistant:

bool BasicPLApproximator<FuncCon>::InitPeriodic() {
  if (IsPeriodic()) {

    breakpoints_ = GetDefaultBreakpoints();

    auto per = GetDefaultPeriod();

    laPrm_.fUsePeriod = true;
    laPrm_.periodLength = per.ub - per.lb;
    laPrm_.periodRemainderRange =
      {breakpoints_.front(), breakpoints_.back()};
    laPrm_.periodicFactorRange = {
      std::floor( (lbx()-per.lb) / laPrm_.periodLength ),
      std::ceil( (ubx()-per.lb) / laPrm_.periodLength )
    };

    return true;
  }
  return false;
}